

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O3

void __thiscall OpenMD::GB::initialize(GB *this)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  bool bVar3;
  undefined4 in_EAX;
  _Rb_tree_node_base *p_Var4;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->GBtypes)._M_t);
  piVar2 = (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::_M_erase_at_end(&this->MixingMap,
                    (this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this->nGB_ = 0;
  uStack_28 = CONCAT44(0xffffffff,(undefined4)uStack_28);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->GBtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,(value_type_conflict1 *)((long)&uStack_28 + 4));
  p_Var4 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this->mu_ = (this->forceField_->forceFieldOptions_).GayBerneMu.data_;
  this->nu_ = (this->forceField_->forceFieldOptions_).GayBerneNu.data_;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  for (; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    bVar3 = AtomType::isGayBerne(*(AtomType **)(p_Var4 + 1));
    if (bVar3) {
      this->nGB_ = this->nGB_ + 1;
    }
    bVar3 = AtomType::isLennardJones(*(AtomType **)(p_Var4 + 1));
    if (bVar3) {
      this->nGB_ = this->nGB_ + 1;
    }
  }
  std::
  vector<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)this->nGB_);
  for (p_Var4 = (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    bVar3 = AtomType::isGayBerne(*(AtomType **)(p_Var4 + 1));
    if ((bVar3) || (bVar3 = AtomType::isLennardJones(*(AtomType **)(p_Var4 + 1)), bVar3)) {
      addType(this,*(AtomType **)(p_Var4 + 1));
    }
  }
  this->initialized_ = true;
  return;
}

Assistant:

void GB::initialize() {
    GBtypes.clear();
    GBtids.clear();
    MixingMap.clear();
    nGB_ = 0;

    GBtids.resize(forceField_->getNAtomType(), -1);

    ForceFieldOptions& fopts = forceField_->getForceFieldOptions();
    mu_                      = fopts.getGayBerneMu();
    nu_                      = fopts.getGayBerneNu();

    // GB handles all of the GB-GB interactions as well as GB-LJ cross
    // interactions:
    AtomTypeSet::iterator at;
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isGayBerne()) nGB_++;
      if ((*at)->isLennardJones()) nGB_++;
    }

    MixingMap.resize(nGB_);
    for (at = simTypes_.begin(); at != simTypes_.end(); ++at) {
      if ((*at)->isGayBerne() || (*at)->isLennardJones()) addType(*at);
    }

    initialized_ = true;
  }